

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCommsCommon.cpp
# Opt level: O3

bool helics::tcp::commErrorHandler(CommsInterface *comm,TcpConnection *param_2,error_code *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *psVar4;
  uint __val;
  uint uVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  uint uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  undefined8 uVar11;
  uint __len;
  string_view message;
  string __str;
  size_type *local_d0;
  error_category *local_c8;
  size_type local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar6 = CommsInterface::isConnected(comm);
  if (!bVar6) {
    return false;
  }
  std::error_code::error_code<asio::error::misc_errors,void>((error_code *)&local_d0,eof);
  if ((error->_M_cat == local_c8) && (error->_M_value == (int)local_d0)) {
    return false;
  }
  std::error_code::error_code<asio::error::basic_errors,void>
            ((error_code *)&local_b0,operation_aborted);
  if ((error->_M_cat == (error_category *)local_b0._M_string_length) &&
     (error->_M_value == (int)local_b0._M_dataplus._M_p)) {
    return false;
  }
  std::error_code::error_code<asio::error::basic_errors,void>
            ((error_code *)&local_d0,connection_reset);
  if ((error->_M_cat == local_c8) && (error->_M_value == (int)local_d0)) {
    return false;
  }
  (**(code **)(*(long *)error->_M_cat + 0x20))(&local_50);
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_50,0,0,"error message while connected ",0x1e);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar3 == paVar9) {
    local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_70.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_70._M_dataplus._M_p = (pointer)paVar3;
  }
  local_70._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70,"code ");
  paVar3 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar9) {
    local_b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  uVar2 = error->_M_value;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar10 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar8 = (uint)uVar10;
      if (uVar8 < 100) {
        __len = __len - 2;
        goto LAB_002d1375;
      }
      if (uVar8 < 1000) {
        __len = __len - 1;
        goto LAB_002d1375;
      }
      if (uVar8 < 10000) goto LAB_002d1375;
      uVar10 = uVar10 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar8);
    __len = __len + 1;
  }
LAB_002d1375:
  paVar9 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_90,(ulong)(__len + -((int)uVar2 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_90._M_dataplus._M_p + (uint)-((int)uVar2 >> 0x1f),__len,__val);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    uVar11 = local_b0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_b0._M_string_length + local_90._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar9) {
      uVar11 = local_90.field_2._M_allocated_capacity;
    }
    if (local_b0._M_string_length + local_90._M_string_length <= (ulong)uVar11) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_90,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      goto LAB_002d1402;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_b0,local_90._M_dataplus._M_p,local_90._M_string_length);
LAB_002d1402:
  local_d0 = &local_c0;
  psVar4 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4 == paVar1) {
    local_c0 = paVar1->_M_allocated_capacity;
    uStack_b8 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_c0 = paVar1->_M_allocated_capacity;
    local_d0 = psVar4;
  }
  local_c8 = (error_category *)pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  message._M_str = (char *)local_d0;
  message._M_len = (size_t)local_c8;
  CommsInterface::logError(comm,message);
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar9) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool commErrorHandler(CommsInterface* comm,
                          gmlc::networking::TcpConnection* /*connection*/,
                          const std::error_code& error)
    {
        if (comm->isConnected()) {
            if ((error != asio::error::eof) && (error != asio::error::operation_aborted)) {
                if (error != asio::error::connection_reset) {
                    comm->logError("error message while connected " + error.message() + "code " +
                                   std::to_string(error.value()));
                }
            }
        }
        return false;
    }